

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O2

void copyhdu(void)

{
  int iVar1;
  int status;
  fitsfile *infptr;
  fitsfile *outfptr;
  int hdutype;
  char outfilename [13];
  char infilename [13];
  
  builtin_strncpy(infilename + 8,".fit",5);
  builtin_strncpy(infilename,"atestfil",8);
  builtin_strncpy(outfilename + 8,".fit",5);
  builtin_strncpy(outfilename,"btestfil",8);
  status = 0;
  remove(outfilename);
  iVar1 = ffopentest(10,&infptr,infilename,0,&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  iVar1 = ffinit(&outfptr,outfilename,&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  iVar1 = ffcopy(infptr,outfptr,0,&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  iVar1 = ffmahd(infptr,3,&hdutype,&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  iVar1 = ffcopy(infptr,outfptr,0,&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  iVar1 = ffclos(outfptr,&status);
  if ((iVar1 == 0) && (iVar1 = ffclos(infptr,&status), iVar1 == 0)) {
    return;
  }
  printerror(status);
  return;
}

Assistant:

void copyhdu( void)
{
    /********************************************************************/
    /* copy the 1st and 3rd HDUs from the input file to a new FITS file */
    /********************************************************************/
    fitsfile *infptr;      /* pointer to the FITS file, defined in fitsio.h */
    fitsfile *outfptr;                 /* pointer to the new FITS file      */

    char infilename[]  = "atestfil.fit";  /* name for existing FITS file   */
    char outfilename[] = "btestfil.fit";  /* name for new FITS file        */

    int status, morekeys, hdutype;

    status = 0;

    remove(outfilename);            /* Delete old file if it already exists */

    /* open the existing FITS file */
    if ( fits_open_file(&infptr, infilename, READONLY, &status) ) 
         printerror( status );

    if (fits_create_file(&outfptr, outfilename, &status)) /*create FITS file*/
         printerror( status );           /* call printerror if error occurs */

    /* copy the primary array from the input file to the output file */
    morekeys = 0;     /* don't reserve space for additional keywords */
    if ( fits_copy_hdu(infptr, outfptr, morekeys, &status) )
         printerror( status );

    /* move to the 3rd HDU in the input file */
    if ( fits_movabs_hdu(infptr, 3, &hdutype, &status) )
         printerror( status );

    /* copy 3rd HDU from the input file to the output file (to 2nd HDU) */
    if ( fits_copy_hdu(infptr, outfptr, morekeys, &status) )
         printerror( status );

    if (fits_close_file(outfptr, &status) ||
        fits_close_file(infptr, &status)) /* close files */
         printerror( status );

    return;
}